

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

double phyr::averageSampleRange(double *lambda,double *v,int n,double lambda0,double lambda1)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  if ((n == 1) || (dVar1 = *lambda, lambda1 <= dVar1)) {
    dVar8 = *v;
  }
  else {
    dVar2 = lambda[(long)n + -1];
    uVar7 = (long)n - 1;
    if (dVar2 <= lambda0) {
      dVar8 = v[uVar7];
    }
    else {
      dVar8 = 0.0;
      if (lambda0 < dVar1) {
        dVar8 = (dVar1 - lambda0) * *v + 0.0;
      }
      if (dVar2 < lambda1) {
        dVar8 = dVar8 + (lambda1 - dVar2) * v[uVar7];
      }
      lVar6 = 0;
      do {
        lVar5 = lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while (lambda[lVar5] <= lambda0 && lambda0 != lambda[lVar5]);
      if ((int)lVar6 + -1 < (int)uVar7) {
        do {
          dVar1 = lambda[lVar6 + -1];
          if (lambda1 <= dVar1) break;
          dVar2 = lambda[lVar6];
          dVar9 = 1.0 / (dVar2 - dVar1);
          uVar4 = (ulong)dVar2 & -(ulong)(dVar2 < lambda1);
          auVar12._0_8_ = ~-(ulong)(lambda0 < dVar1) & (ulong)lambda0;
          auVar12._8_8_ = ~-(ulong)(dVar2 < lambda1) & (ulong)lambda1;
          auVar3._8_4_ = (int)uVar4;
          auVar3._0_8_ = (ulong)dVar1 & -(ulong)(lambda0 < dVar1);
          auVar3._12_4_ = (int)(uVar4 >> 0x20);
          dVar11 = SUB168(auVar12 | auVar3,0);
          dVar2 = SUB168(auVar12 | auVar3,8);
          dVar10 = dVar9 * (dVar11 - dVar1);
          dVar9 = dVar9 * (dVar2 - dVar1);
          dVar8 = dVar8 + (v[lVar6 + -1] * (1.0 - dVar9) + v[lVar6] * dVar9 +
                          v[lVar6 + -1] * (1.0 - dVar10) + v[lVar6] * dVar10) *
                          (dVar2 - dVar11) * 0.5;
          lVar6 = lVar6 + 1;
        } while ((uVar7 & 0xffffffff) + 1 != lVar6);
      }
      dVar8 = dVar8 / (lambda1 - lambda0);
    }
  }
  return dVar8;
}

Assistant:

Real averageSampleRange(const Real* lambda, const Real* v, int n,
                        Real lambda0, Real lambda1) {
    // Check for edge cases
    if (lambda1 <= lambda[0] || n == 1) return v[0];
    if (lambda0 >= lambda[n-1]) return v[n-1];

    // Check for cases of range partial overlap

    // {vsum} stores area under the curve of the overlapped region
    Real vsum = 0;
    if (lambda0 < lambda[0])
        vsum += v[0] * (lambda[0] - lambda0);
    if (lambda1 > lambda[n-1])
        vsum += v[n-1] * (lambda1 - lambda[n-1]);

    // Find first overlapping wavelength segment
    int i = 0;
    while (lambda[i+1] < lambda0) i++;

    // Iterate over overlapping segments
    for (; i < n - 1 && lambda[i] < lambda1; i++) {
        // Compute segment limits
        Real seg0 = std::max(lambda0, lambda[i]);
        Real seg1 = std::min(lambda1, lambda[i+1]);

        // Interpolated values
        Real invLambdaRange = 1.0 / (lambda[i+1] - lambda[i]);
        Real v0 = lerp((seg0 - lambda[i]) * invLambdaRange, v[i], v[i+1]);
        Real v1 = lerp((seg1 - lambda[i]) * invLambdaRange, v[i], v[i+1]);

        // Add the calculated area
        vsum += 0.5 * (seg1 - seg0) * (v0 + v1);
    }

    // Return average value
    return vsum / (lambda1 - lambda0);
}